

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

int compute_reciprocal(UINT16 divisor,DCTELEM *dtbl)

{
  int iVar1;
  uint uVar2;
  undefined2 *in_RSI;
  UINT16 in_DI;
  int r;
  int b;
  UDCTELEM c;
  UDCTELEM2 fr;
  UDCTELEM2 fq;
  int local_24;
  ushort local_1a;
  uint local_14;
  int local_4;
  
  if (in_DI == 1) {
    *in_RSI = 1;
    in_RSI[0x40] = 0;
    in_RSI[0x80] = 1;
    in_RSI[0xc0] = 0xfff0;
    local_4 = 0;
  }
  else {
    iVar1 = flss(in_DI);
    local_24 = iVar1 + 0xf;
    local_14 = (uint)(1 << ((byte)local_24 & 0x1f)) / (uint)in_DI;
    uVar2 = (uint)(1 << ((byte)local_24 & 0x1f)) % (uint)in_DI;
    local_1a = in_DI / 2;
    if (uVar2 == 0) {
      local_14._0_2_ = (undefined2)(local_14 >> 1);
      local_24 = iVar1 + 0xe;
    }
    else {
      if (in_DI >> 1 < uVar2) {
        local_14 = local_14 + 1;
      }
      else {
        local_1a = local_1a + 1;
      }
    }
    *in_RSI = (undefined2)local_14;
    in_RSI[0x40] = local_1a;
    in_RSI[0x80] = (short)(1 << (0x20U - (char)local_24 & 0x1f));
    in_RSI[0xc0] = (short)local_24 + -0x10;
    if (local_24 < 0x11) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

LOCAL(int)
compute_reciprocal(UINT16 divisor, DCTELEM *dtbl)
{
  UDCTELEM2 fq, fr;
  UDCTELEM c;
  int b, r;

  if (divisor == 1) {
    /* divisor == 1 means unquantized, so these reciprocal/correction/shift
     * values will cause the C quantization algorithm to act like the
     * identity function.  Since only the C quantization algorithm is used in
     * these cases, the scale value is irrelevant.
     */
    dtbl[DCTSIZE2 * 0] = (DCTELEM)1;                        /* reciprocal */
    dtbl[DCTSIZE2 * 1] = (DCTELEM)0;                        /* correction */
    dtbl[DCTSIZE2 * 2] = (DCTELEM)1;                        /* scale */
    dtbl[DCTSIZE2 * 3] = -(DCTELEM)(sizeof(DCTELEM) * 8);   /* shift */
    return 0;
  }

  b = flss(divisor) - 1;
  r  = sizeof(DCTELEM) * 8 + b;

  fq = ((UDCTELEM2)1 << r) / divisor;
  fr = ((UDCTELEM2)1 << r) % divisor;

  c = divisor / 2;                      /* for rounding */

  if (fr == 0) {                        /* divisor is power of two */
    /* fq will be one bit too large to fit in DCTELEM, so adjust */
    fq >>= 1;
    r--;
  } else if (fr <= (divisor / 2U)) {    /* fractional part is < 0.5 */
    c++;
  } else {                              /* fractional part is > 0.5 */
    fq++;
  }

  dtbl[DCTSIZE2 * 0] = (DCTELEM)fq;     /* reciprocal */
  dtbl[DCTSIZE2 * 1] = (DCTELEM)c;      /* correction + roundfactor */
#ifdef WITH_SIMD
  dtbl[DCTSIZE2 * 2] = (DCTELEM)(1 << (sizeof(DCTELEM) * 8 * 2 - r)); /* scale */
#else
  dtbl[DCTSIZE2 * 2] = 1;
#endif
  dtbl[DCTSIZE2 * 3] = (DCTELEM)r - sizeof(DCTELEM) * 8; /* shift */

  if (r <= 16) return 0;
  else return 1;
}